

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdc-reader.cc
# Opt level: O3

bool __thiscall
tinyusdz::usdc::USDCReader::Impl::ReconstrcutStageMeta
          (Impl *this,FieldValuePairVector *fvs,StageMetas *metas)

{
  vtable_type *pvVar1;
  undefined8 uVar2;
  undefined1 *puVar3;
  storage_t<bool> sVar4;
  int iVar5;
  storage_t<tinyusdz::Axis> sVar6;
  storage_t<tinyusdz::LayerMetas::PlaybackMode> sVar7;
  undefined4 uVar8;
  ostream *poVar9;
  ostringstream *this_00;
  undefined8 *puVar10;
  storage_t<double> *psVar11;
  long *plVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  ulong uVar14;
  size_type *psVar15;
  bool *pbVar16;
  long lVar17;
  ostringstream oVar18;
  ulong uVar19;
  storage_t<double> sVar20;
  char *pcVar21;
  storage_t<double> sVar22;
  Impl *this_01;
  pointer ppVar23;
  pointer __rhs;
  long lVar24;
  bool bVar25;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> v;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> vs;
  ostringstream ss_w;
  vector<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_> subLayerOffsets;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  subLayers;
  undefined1 local_310 [8];
  undefined1 local_308 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_300;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  Impl *local_2d0;
  storage_t<double> local_2c8;
  storage_t<double> sStack_2c0;
  storage_t<double> local_2b8;
  storage_t<double> sStack_2b0;
  undefined8 uStack_2a8;
  string local_2a0;
  StageMetas *local_280;
  string local_278;
  undefined8 local_258;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  undefined1 local_240 [4];
  float fStack_23c;
  undefined1 local_238 [16];
  undefined1 local_228 [8];
  string asStack_220 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  undefined4 local_200;
  undefined4 uStack_1fc;
  undefined4 uStack_1f8;
  undefined4 uStack_1f4;
  ios_base local_1d0 [264];
  vector<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_> local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  string local_88;
  bool *local_68;
  string *local_60;
  bool *local_58;
  string *local_50;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *local_48;
  CustomDataType *local_40;
  string *local_38;
  
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.super__Vector_base<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.super__Vector_base<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.super__Vector_base<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  __rhs = (fvs->
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  ppVar23 = (fvs->
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (__rhs == ppVar23) {
LAB_0017f9ff:
    if (local_c8.super__Vector_base<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_c8.super__Vector_base<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      bVar25 = true;
      goto LAB_001803ff;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"[warn]",6);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
               ,0x55);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_240,"ReconstrcutStageMeta",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"():",3);
    poVar9 = (ostream *)::std::ostream::operator<<((ostringstream *)local_240,0x6de);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_240,"Corrupted subLayer info? `subLayers` Fileld not found.",0x36);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"\n",1);
    ::std::__cxx11::stringbuf::str();
    PushWarn(this,(string *)local_310);
    if (local_310 != (undefined1  [8])(local_308 + 8)) {
      operator_delete((void *)local_310,aStack_300._M_allocated_capacity + 1);
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_240);
    ::std::ios_base::~ios_base(local_1d0);
  }
  else {
    local_60 = (string *)&metas->comment;
    local_68 = &(metas->comment).is_triple_quoted;
    local_50 = (string *)&metas->doc;
    local_58 = &(metas->doc).is_triple_quoted;
    local_48 = &metas->primChildren;
    local_40 = &metas->customLayerData;
    local_38 = (string *)&metas->defaultPrim;
    local_2d0 = this;
    local_258 = ppVar23;
    do {
      iVar5 = ::std::__cxx11::string::compare((char *)__rhs);
      if (iVar5 == 0) {
        crate::CrateValue::get_value<tinyusdz::Token>
                  ((optional<tinyusdz::Token> *)local_240,&__rhs->second);
        local_310[0] = (string)local_240[0];
        if (local_240[0] == (ostringstream)0x1) {
          if ((undefined1 *)local_238._0_8_ == local_228) {
            paStack_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(asStack_220._4_4_,
                                      CONCAT22(asStack_220._2_2_,
                                               CONCAT11(asStack_220[1],asStack_220[0])));
            local_308 = (undefined1  [8])((long)aStack_300._M_local_buf + 8);
          }
          else {
            local_308 = (undefined1  [8])local_238._0_8_;
          }
          aStack_300._8_8_ = local_228;
          aStack_300._M_allocated_capacity = local_238._8_8_;
          local_2c8 = (storage_t<double>)&local_2b8;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2c8,local_308,local_238._8_8_ + (long)local_308);
          iVar5 = ::std::__cxx11::string::compare((char *)&local_2c8);
          if (iVar5 == 0) {
            sVar6 = (storage_t<tinyusdz::Axis>)0x1;
          }
          else {
            iVar5 = ::std::__cxx11::string::compare((char *)&local_2c8);
            if (iVar5 == 0) {
              sVar6 = (storage_t<tinyusdz::Axis>)0x2;
            }
            else {
              iVar5 = ::std::__cxx11::string::compare((char *)&local_2c8);
              if (iVar5 != 0) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_240,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_240,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                           ,0x55);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_240,"ReconstrcutStageMeta",0x14);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"():",3);
                poVar9 = (ostream *)::std::ostream::operator<<((ostringstream *)local_240,0x60f);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_278,"`upAxis` must be \'X\', \'Y\' or \'Z\' but got \'",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_2c8);
                plVar12 = (long *)::std::__cxx11::string::append((char *)&local_278);
                psVar15 = (size_type *)(plVar12 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar12 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar15) {
                  local_2a0.field_2._M_allocated_capacity = *psVar15;
                  local_2a0.field_2._8_8_ = plVar12[3];
                  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
                }
                else {
                  local_2a0.field_2._M_allocated_capacity = *psVar15;
                  local_2a0._M_dataplus._M_p = (pointer)*plVar12;
                }
                local_2a0._M_string_length = plVar12[1];
                *plVar12 = (long)psVar15;
                plVar12[1] = 0;
                *(undefined1 *)(plVar12 + 2) = 0;
                poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_240,local_2a0._M_dataplus._M_p,
                                    local_2a0._M_string_length);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
                  operator_delete(local_2a0._M_dataplus._M_p,
                                  local_2a0.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_278._M_dataplus._M_p != &local_278.field_2) {
                  operator_delete(local_278._M_dataplus._M_p,
                                  CONCAT44(local_278.field_2._M_allocated_capacity._4_4_,
                                           local_278.field_2._M_allocated_capacity._0_4_) + 1);
                }
                ::std::__cxx11::stringbuf::str();
                PushError(local_2d0,&local_2a0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
                  operator_delete(local_2a0._M_dataplus._M_p,
                                  local_2a0.field_2._M_allocated_capacity + 1);
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_240);
                ::std::ios_base::~ios_base(local_1d0);
                sVar20 = local_2b8;
                sVar22 = local_2c8;
                if (local_2c8 != (storage_t<double>)&local_2b8) {
LAB_0018004c:
                  operator_delete((void *)sVar22,(long)sVar20 + 1);
                }
LAB_00180054:
                goto joined_r0x0017fc5d;
              }
              sVar6 = (storage_t<tinyusdz::Axis>)0x0;
            }
          }
          ppVar23 = local_258;
          if ((metas->upAxis)._attrib.has_value_ == false) {
            (metas->upAxis)._attrib.has_value_ = true;
          }
          (metas->upAxis)._attrib.contained = sVar6;
          if (local_2c8 != (storage_t<double>)&local_2b8) {
            operator_delete((void *)local_2c8,(long)local_2b8 + 1);
          }
LAB_0017dff3:
          if ((local_310[0] == (string)0x1) &&
             (local_308 != (undefined1  [8])((long)aStack_300._M_local_buf + 8))) {
LAB_0017e00c:
            operator_delete((void *)local_308,aStack_300._8_8_ + 1);
          }
          goto LAB_0017e1b1;
        }
        this_00 = (ostringstream *)local_240;
        ::std::__cxx11::ostringstream::ostringstream(this_00);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                   ,0x55);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"ReconstrcutStageMeta",0x14);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"():",3);
        poVar9 = (ostream *)::std::ostream::operator<<(this_00,0x603);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"`upAxis` must be `token` type.",0x1e);
LAB_0017fbf1:
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\n",1);
LAB_0017fbf6:
        ::std::__cxx11::stringbuf::str();
        PushError(local_2d0,(string *)&local_2c8);
        if (local_2c8 != (storage_t<double>)&local_2b8) {
          operator_delete((void *)local_2c8,(long)local_2b8 + 1);
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_240);
        ::std::ios_base::~ios_base(local_1d0);
joined_r0x0017fc5d:
        if ((local_310[0] == (string)0x1) &&
           (local_308 != (undefined1  [8])((long)aStack_300._M_local_buf + 8))) {
          operator_delete((void *)local_308,aStack_300._8_8_ + 1);
        }
LAB_001803f5:
        bVar25 = false;
        goto LAB_001803ff;
      }
      iVar5 = ::std::__cxx11::string::compare((char *)__rhs);
      if (iVar5 == 0) {
        tinyusdz::value::Value::get_value<float>
                  ((optional<float> *)local_240,&(__rhs->second).value_,false);
        if (local_240[0] == (ostringstream)0x1) {
          if ((metas->metersPerUnit)._attrib.has_value_ == false) {
            (metas->metersPerUnit)._attrib.has_value_ = true;
          }
          (metas->metersPerUnit)._attrib.contained = (storage_t<double>)(double)fStack_23c;
        }
        else {
          tinyusdz::value::Value::get_value<double>
                    ((optional<double> *)local_240,&(__rhs->second).value_,false);
          if (local_240[0] != (ostringstream)0x1) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_240,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                       ,0x55);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_240,"ReconstrcutStageMeta",0x14);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"():",3);
            poVar9 = (ostream *)::std::ostream::operator<<((ostringstream *)local_240,0x61b);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
            pvVar1 = (__rhs->second).value_.v_.vtable;
            if (pvVar1 == (vtable_type *)0x0) {
              local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
              local_2a0._M_string_length = 4;
              local_2a0.field_2._M_allocated_capacity._0_5_ = 0x64696f76;
            }
            else {
              (*pvVar1->type_name)(&local_2a0);
            }
            pcVar21 = "`metersPerUnit` value must be double or float type, but got \'";
LAB_00180283:
            this_01 = local_2d0;
            psVar11 = (storage_t<double> *)
                      ::std::__cxx11::string::replace
                                ((ulong)&local_2a0,0,(char *)0x0,(ulong)pcVar21);
            sVar20 = (storage_t<double>)(psVar11 + 2);
            if (*psVar11 == sVar20) {
              local_2b8 = *(storage_t<double> *)sVar20;
              sStack_2b0 = psVar11[3];
              local_2c8 = (storage_t<double>)&local_2b8;
            }
            else {
              local_2b8 = *(storage_t<double> *)sVar20;
              local_2c8 = *psVar11;
            }
            sStack_2c0 = psVar11[1];
            *psVar11 = sVar20;
            psVar11[1] = (storage_t<double>)0x0;
            *(undefined1 *)(psVar11 + 2) = 0;
            plVar12 = (long *)::std::__cxx11::string::append((char *)&local_2c8);
            psVar11 = (storage_t<double> *)(plVar12 + 2);
            if ((storage_t<double> *)*plVar12 == psVar11) {
              aStack_300._M_allocated_capacity = (size_type)*psVar11;
              aStack_300._8_8_ = *(storage_t<double> *)(plVar12 + 3);
              local_310 = (undefined1  [8])(local_308 + 8);
            }
            else {
              aStack_300._M_allocated_capacity = (size_type)*psVar11;
              local_310 = (undefined1  [8])*plVar12;
            }
            local_308 = *(undefined1 (*) [8])(plVar12 + 1);
            *plVar12 = (long)psVar11;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_240,(char *)local_310,(long)local_308);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
            if (local_310 != (undefined1  [8])(local_308 + 8)) {
              operator_delete((void *)local_310,aStack_300._M_allocated_capacity + 1);
            }
            if (local_2c8 != (storage_t<double>)&local_2b8) {
              operator_delete((void *)local_2c8,(long)local_2b8 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
              operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1
                             );
            }
            ::std::__cxx11::stringbuf::str();
LAB_001803b2:
            PushError(this_01,(string *)local_310);
            if (local_310 != (undefined1  [8])(local_308 + 8)) {
              operator_delete((void *)local_310,aStack_300._M_allocated_capacity + 1);
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_240);
            ::std::ios_base::~ios_base(local_1d0);
            goto LAB_001803f5;
          }
          if ((metas->metersPerUnit)._attrib.has_value_ == false) {
            (metas->metersPerUnit)._attrib.has_value_ = true;
          }
          (metas->metersPerUnit)._attrib.contained = (storage_t<double>)local_238._0_8_;
        }
      }
      else {
        iVar5 = ::std::__cxx11::string::compare((char *)__rhs);
        if (iVar5 == 0) {
          tinyusdz::value::Value::get_value<float>
                    ((optional<float> *)local_240,&(__rhs->second).value_,false);
          if (local_240[0] == (ostringstream)0x1) {
            if ((metas->kilogramsPerUnit)._attrib.has_value_ == false) {
              (metas->kilogramsPerUnit)._attrib.has_value_ = true;
            }
            sVar20 = (storage_t<double>)(double)fStack_23c;
          }
          else {
            tinyusdz::value::Value::get_value<double>
                      ((optional<double> *)local_240,&(__rhs->second).value_,false);
            if (local_240[0] != (ostringstream)0x1) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_240,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                         ,0x55);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_240,"ReconstrcutStageMeta",0x14);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"():",3);
              poVar9 = (ostream *)::std::ostream::operator<<((ostringstream *)local_240,0x626);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
              pvVar1 = (__rhs->second).value_.v_.vtable;
              if (pvVar1 == (vtable_type *)0x0) {
                local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
                local_2a0._M_string_length = 4;
                local_2a0.field_2._M_allocated_capacity._0_5_ = 0x64696f76;
              }
              else {
                (*pvVar1->type_name)(&local_2a0);
              }
              pcVar21 = "`kilogramsPerUnit` value must be double or float type, but got \'";
              goto LAB_00180283;
            }
            sVar20 = (storage_t<double>)local_238._0_8_;
            if ((metas->kilogramsPerUnit)._attrib.has_value_ == false) {
              (metas->kilogramsPerUnit)._attrib.has_value_ = true;
            }
          }
          (metas->kilogramsPerUnit)._attrib.contained = sVar20;
        }
        else {
          iVar5 = ::std::__cxx11::string::compare((char *)__rhs);
          if (iVar5 == 0) {
            tinyusdz::value::Value::get_value<float>
                      ((optional<float> *)local_240,&(__rhs->second).value_,false);
            if (local_240[0] == (ostringstream)0x1) {
              if ((metas->timeCodesPerSecond)._attrib.has_value_ == false) {
                (metas->timeCodesPerSecond)._attrib.has_value_ = true;
              }
              sVar20 = (storage_t<double>)(double)fStack_23c;
            }
            else {
              tinyusdz::value::Value::get_value<double>
                        ((optional<double> *)local_240,&(__rhs->second).value_,false);
              if (local_240[0] != (ostringstream)0x1) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_240,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_240,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                           ,0x55);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_240,"ReconstrcutStageMeta",0x14);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"():",3);
                poVar9 = (ostream *)::std::ostream::operator<<((ostringstream *)local_240,0x632);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
                pvVar1 = (__rhs->second).value_.v_.vtable;
                if (pvVar1 == (vtable_type *)0x0) {
                  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
                  local_2a0._M_string_length = 4;
                  local_2a0.field_2._M_allocated_capacity._0_5_ = 0x64696f76;
                }
                else {
                  (*pvVar1->type_name)(&local_2a0);
                }
                pcVar21 = "`timeCodesPerSecond` value must be double or float type, but got \'";
                goto LAB_00180283;
              }
              sVar20 = (storage_t<double>)local_238._0_8_;
              if ((metas->timeCodesPerSecond)._attrib.has_value_ == false) {
                (metas->timeCodesPerSecond)._attrib.has_value_ = true;
              }
            }
            (metas->timeCodesPerSecond)._attrib.contained = sVar20;
          }
          else {
            iVar5 = ::std::__cxx11::string::compare((char *)__rhs);
            if (iVar5 == 0) {
              tinyusdz::value::Value::get_value<float>
                        ((optional<float> *)local_240,&(__rhs->second).value_,false);
              if (local_240[0] == (ostringstream)0x1) {
                if ((metas->startTimeCode)._attrib.has_value_ == false) {
                  (metas->startTimeCode)._attrib.has_value_ = true;
                }
                sVar20 = (storage_t<double>)(double)fStack_23c;
              }
              else {
                tinyusdz::value::Value::get_value<double>
                          ((optional<double> *)local_240,&(__rhs->second).value_,false);
                if (local_240[0] != (ostringstream)0x1) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_240,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_240,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                             ,0x55);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_240,"ReconstrcutStageMeta",0x14);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"():",3)
                  ;
                  poVar9 = (ostream *)::std::ostream::operator<<((ostringstream *)local_240,0x63e);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
                  pvVar1 = (__rhs->second).value_.v_.vtable;
                  if (pvVar1 == (vtable_type *)0x0) {
                    local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
                    local_2a0._M_string_length = 4;
                    local_2a0.field_2._M_allocated_capacity._0_5_ = 0x64696f76;
                  }
                  else {
                    (*pvVar1->type_name)(&local_2a0);
                  }
                  pcVar21 = "`startTimeCode` value must be double or float type, but got \'";
                  goto LAB_00180283;
                }
                sVar20 = (storage_t<double>)local_238._0_8_;
                if ((metas->startTimeCode)._attrib.has_value_ == false) {
                  (metas->startTimeCode)._attrib.has_value_ = true;
                }
              }
              (metas->startTimeCode)._attrib.contained = sVar20;
            }
            else {
              iVar5 = ::std::__cxx11::string::compare((char *)__rhs);
              if (iVar5 == 0) {
                crate::CrateValue::
                get_value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                          ((optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_240,&__rhs->second);
                local_310[0] = (string)local_240[0];
                oVar18 = local_240[0];
                if (local_240[0] == (ostringstream)0x1) {
                  local_308 = (undefined1  [8])local_238._0_8_;
                  aStack_300._M_allocated_capacity = local_238._8_8_;
                  aStack_300._8_8_ = local_228;
                  local_238._0_8_ = (storage_t<double>)0x0;
                  local_238._8_8_ = (storage_t<double>)0x0;
                  local_228 = (undefined1  [8])0x0;
                  ::std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_238);
                  oVar18 = (ostringstream)local_310[0];
                }
                if (((byte)oVar18 & 1) == 0) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_240,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_240,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                             ,0x55);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_240,"ReconstrcutStageMeta",0x14);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"():",3)
                  ;
                  poVar9 = (ostream *)::std::ostream::operator<<((ostringstream *)local_240,0x648);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
                  pvVar1 = (__rhs->second).value_.v_.vtable;
                  if (pvVar1 == (vtable_type *)0x0) {
                    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
                    local_278.field_2._M_allocated_capacity._0_4_ = 0x64696f76;
                    local_278._M_string_length = 4;
                    local_278.field_2._M_allocated_capacity._4_4_ =
                         local_278.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
                  }
                  else {
                    (*pvVar1->type_name)(&local_278);
                  }
                  local_280 = metas;
                  plVar12 = (long *)::std::__cxx11::string::replace
                                              ((ulong)&local_278,0,(char *)0x0,0x3d4739);
                  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
                  psVar15 = (size_type *)(plVar12 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar12 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar15) {
                    local_2a0.field_2._M_allocated_capacity = *psVar15;
                    local_2a0.field_2._8_8_ = plVar12[3];
                  }
                  else {
                    local_2a0.field_2._M_allocated_capacity = *psVar15;
                    local_2a0._M_dataplus._M_p = (pointer)*plVar12;
                  }
                  local_2a0._M_string_length = plVar12[1];
                  *plVar12 = (long)psVar15;
                  plVar12[1] = 0;
                  *(undefined1 *)(plVar12 + 2) = 0;
                  psVar11 = (storage_t<double> *)::std::__cxx11::string::append((char *)&local_2a0);
                  sVar20 = (storage_t<double>)(psVar11 + 2);
                  if (*psVar11 == sVar20) {
                    local_2b8 = *(storage_t<double> *)sVar20;
                    sStack_2b0 = psVar11[3];
                    local_2c8 = (storage_t<double>)&local_2b8;
                  }
                  else {
                    local_2b8 = *(storage_t<double> *)sVar20;
                    local_2c8 = *psVar11;
                  }
                  sStack_2c0 = psVar11[1];
                  *psVar11 = sVar20;
                  psVar11[1] = (storage_t<double>)0x0;
                  *(undefined1 *)(psVar11 + 2) = 0;
                  poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)local_240,(char *)local_2c8,(long)sStack_2c0);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                  if (local_2c8 != (storage_t<double>)&local_2b8) {
                    operator_delete((void *)local_2c8,(long)local_2b8 + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
                    operator_delete(local_2a0._M_dataplus._M_p,
                                    local_2a0.field_2._M_allocated_capacity + 1);
                  }
                  metas = local_280;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_278._M_dataplus._M_p != &local_278.field_2) {
                    operator_delete(local_278._M_dataplus._M_p,
                                    CONCAT44(local_278.field_2._M_allocated_capacity._4_4_,
                                             local_278.field_2._M_allocated_capacity._0_4_) + 1);
                  }
                  ::std::__cxx11::stringbuf::str();
                  PushError(local_2d0,(string *)&local_2c8);
                  if (local_2c8 != (storage_t<double>)&local_2b8) {
                    operator_delete((void *)local_2c8,(long)local_2b8 + 1);
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_240);
                  ::std::ios_base::~ios_base(local_1d0);
                  ppVar23 = local_258;
                }
                else {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator=(&local_a8,
                              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_308);
                }
                if (local_310[0] == (string)0x1) {
                  ::std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_308);
                }
                goto LAB_0017e654;
              }
              iVar5 = ::std::__cxx11::string::compare((char *)__rhs);
              if (iVar5 == 0) {
                tinyusdz::value::Value::
                get_value<std::vector<tinyusdz::LayerOffset,std::allocator<tinyusdz::LayerOffset>>>
                          ((optional<std::vector<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>_>
                            *)local_240,&(__rhs->second).value_,false);
                oVar18 = local_240[0];
                if (local_240[0] == (ostringstream)0x1) {
                  local_308 = (undefined1  [8])local_238._0_8_;
                  aStack_300._M_allocated_capacity = local_238._8_8_;
                  aStack_300._8_8_ = local_228;
                  local_310[0] = (string)0x1;
                  ::std::vector<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>::
                  operator=(&local_c8,
                            (vector<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_> *
                            )local_308);
                }
                else {
                  local_310[0] = (string)local_240[0];
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_240,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_240,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                             ,0x55);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_240,"ReconstrcutStageMeta",0x14);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"():",3)
                  ;
                  poVar9 = (ostream *)
                           ::std::ostream::operator<<
                                     ((optional<std::vector<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>_>
                                       *)local_240,0x651);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
                  pvVar1 = (__rhs->second).value_.v_.vtable;
                  if (pvVar1 == (vtable_type *)0x0) {
                    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
                    local_278.field_2._M_allocated_capacity._0_4_ = 0x64696f76;
                    local_278._M_string_length = 4;
                    local_278.field_2._M_allocated_capacity._4_4_ =
                         local_278.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
                  }
                  else {
                    (*pvVar1->type_name)(&local_278);
                  }
                  local_280 = metas;
                  plVar12 = (long *)::std::__cxx11::string::replace
                                              ((ulong)&local_278,0,(char *)0x0,0x3d477c);
                  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
                  psVar15 = (size_type *)(plVar12 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar12 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar15) {
                    local_2a0.field_2._M_allocated_capacity = *psVar15;
                    local_2a0.field_2._8_8_ = plVar12[3];
                  }
                  else {
                    local_2a0.field_2._M_allocated_capacity = *psVar15;
                    local_2a0._M_dataplus._M_p = (pointer)*plVar12;
                  }
                  local_2a0._M_string_length = plVar12[1];
                  *plVar12 = (long)psVar15;
                  plVar12[1] = 0;
                  *(undefined1 *)(plVar12 + 2) = 0;
                  psVar11 = (storage_t<double> *)::std::__cxx11::string::append((char *)&local_2a0);
                  sVar20 = (storage_t<double>)(psVar11 + 2);
                  if (*psVar11 == sVar20) {
                    local_2b8 = *(storage_t<double> *)sVar20;
                    sStack_2b0 = psVar11[3];
                    local_2c8 = (storage_t<double>)&local_2b8;
                  }
                  else {
                    local_2b8 = *(storage_t<double> *)sVar20;
                    local_2c8 = *psVar11;
                  }
                  sStack_2c0 = psVar11[1];
                  *psVar11 = sVar20;
                  psVar11[1] = (storage_t<double>)0x0;
                  *(undefined1 *)(psVar11 + 2) = 0;
                  poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)local_240,(char *)local_2c8,(long)sStack_2c0);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                  if (local_2c8 != (storage_t<double>)&local_2b8) {
                    operator_delete((void *)local_2c8,(long)local_2b8 + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
                    operator_delete(local_2a0._M_dataplus._M_p,
                                    local_2a0.field_2._M_allocated_capacity + 1);
                  }
                  metas = local_280;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_278._M_dataplus._M_p != &local_278.field_2) {
                    operator_delete(local_278._M_dataplus._M_p,
                                    CONCAT44(local_278.field_2._M_allocated_capacity._4_4_,
                                             local_278.field_2._M_allocated_capacity._0_4_) + 1);
                  }
                  ::std::__cxx11::stringbuf::str();
                  PushError(local_2d0,(string *)&local_2c8);
                  if (local_2c8 != (storage_t<double>)&local_2b8) {
                    operator_delete((void *)local_2c8,(long)local_2b8 + 1);
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_240);
                  ::std::ios_base::~ios_base(local_1d0);
                  ppVar23 = local_258;
                }
                if ((local_310[0] == (string)0x1) &&
                   ((storage_t<double>)local_308 != (storage_t<double>)0x0)) {
                  operator_delete((void *)local_308,aStack_300._8_8_ - (long)local_308);
                }
                if (oVar18 == (ostringstream)0x0) goto LAB_001803f5;
              }
              else {
                iVar5 = ::std::__cxx11::string::compare((char *)__rhs);
                if (iVar5 == 0) {
                  tinyusdz::value::Value::get_value<float>
                            ((optional<float> *)local_240,&(__rhs->second).value_,false);
                  if (local_240[0] == (ostringstream)0x1) {
                    if ((metas->endTimeCode)._attrib.has_value_ == false) {
                      (metas->endTimeCode)._attrib.has_value_ = true;
                    }
                    sVar20 = (storage_t<double>)(double)fStack_23c;
                  }
                  else {
                    tinyusdz::value::Value::get_value<double>
                              ((optional<double> *)local_240,&(__rhs->second).value_,false);
                    if (local_240[0] != (ostringstream)0x1) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_240,"[error]",7);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_240,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                 ,0x55);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_240,":",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_240,"ReconstrcutStageMeta",0x14);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_240,"():",3);
                      poVar9 = (ostream *)
                               ::std::ostream::operator<<((ostringstream *)local_240,0x65c);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
                      pvVar1 = (__rhs->second).value_.v_.vtable;
                      if (pvVar1 == (vtable_type *)0x0) {
                        local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
                        local_2a0._M_string_length = 4;
                        local_2a0.field_2._M_allocated_capacity._0_5_ = 0x64696f76;
                      }
                      else {
                        (*pvVar1->type_name)(&local_2a0);
                      }
                      this_01 = local_2d0;
                      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&local_2c8,
                                       "`endTimeCode` value must be double or float type, but got \'"
                                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&local_2a0);
                      plVar12 = (long *)::std::__cxx11::string::append((char *)&local_2c8);
                      psVar11 = (storage_t<double> *)(plVar12 + 2);
                      if ((storage_t<double> *)*plVar12 == psVar11) {
                        aStack_300._M_allocated_capacity = (size_type)*psVar11;
                        aStack_300._8_8_ = *(storage_t<double> *)(plVar12 + 3);
                        local_310 = (undefined1  [8])(local_308 + 8);
                      }
                      else {
                        aStack_300._M_allocated_capacity = (size_type)*psVar11;
                        local_310 = (undefined1  [8])*plVar12;
                      }
                      local_308 = *(undefined1 (*) [8])(plVar12 + 1);
                      *plVar12 = (long)psVar11;
                      plVar12[1] = 0;
                      *(undefined1 *)(plVar12 + 2) = 0;
                      poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                                         ((ostream *)local_240,(char *)local_310,(long)local_308);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                      if (local_310 != (undefined1  [8])(local_308 + 8)) {
LAB_00180732:
                        operator_delete((void *)local_310,aStack_300._M_allocated_capacity + 1);
                      }
LAB_0018073f:
                      if (local_2c8 != (storage_t<double>)&local_2b8) {
                        operator_delete((void *)local_2c8,(long)local_2b8 + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
                        operator_delete(local_2a0._M_dataplus._M_p,
                                        local_2a0.field_2._M_allocated_capacity + 1);
                      }
                      ::std::__cxx11::stringbuf::str();
                      goto LAB_001803b2;
                    }
                    sVar20 = (storage_t<double>)local_238._0_8_;
                    if ((metas->endTimeCode)._attrib.has_value_ == false) {
                      (metas->endTimeCode)._attrib.has_value_ = true;
                    }
                  }
                  (metas->endTimeCode)._attrib.contained = sVar20;
                }
                else {
                  iVar5 = ::std::__cxx11::string::compare((char *)__rhs);
                  if (iVar5 == 0) {
                    tinyusdz::value::Value::get_value<float>
                              ((optional<float> *)local_240,&(__rhs->second).value_,false);
                    if (local_240[0] == (ostringstream)0x1) {
                      if ((metas->framesPerSecond)._attrib.has_value_ == false) {
                        (metas->framesPerSecond)._attrib.has_value_ = true;
                      }
                      sVar20 = (storage_t<double>)(double)fStack_23c;
                    }
                    else {
                      tinyusdz::value::Value::get_value<double>
                                ((optional<double> *)local_240,&(__rhs->second).value_,false);
                      if (local_240[0] != (ostringstream)0x1) {
                        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_240,"[error]",7);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_240,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                   ,0x55);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_240,":",1);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_240,"ReconstrcutStageMeta",0x14);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_240,"():",3);
                        poVar9 = (ostream *)
                                 ::std::ostream::operator<<((ostringstream *)local_240,0x668);
                        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
                        pvVar1 = (__rhs->second).value_.v_.vtable;
                        if (pvVar1 == (vtable_type *)0x0) {
                          local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
                          local_2a0._M_string_length = 4;
                          local_2a0.field_2._M_allocated_capacity._0_5_ = 0x64696f76;
                        }
                        else {
                          (*pvVar1->type_name)(&local_2a0);
                        }
                        this_01 = local_2d0;
                        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&local_2c8,
                                         "`framesPerSecond` value must be double or float type, but got \'"
                                         ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&local_2a0);
                        puVar10 = (undefined8 *)::std::__cxx11::string::append((char *)&local_2c8);
                        psVar11 = (storage_t<double> *)(puVar10 + 2);
                        if ((storage_t<double> *)*puVar10 == psVar11) {
                          aStack_300._M_allocated_capacity = (size_type)*psVar11;
                          aStack_300._8_8_ = *(storage_t<double> *)(puVar10 + 3);
                          local_310 = (undefined1  [8])(local_308 + 8);
                        }
                        else {
                          aStack_300._M_allocated_capacity = (size_type)*psVar11;
                          local_310 = (undefined1  [8])*puVar10;
                        }
                        local_308 = *(undefined1 (*) [8])(puVar10 + 1);
                        *puVar10 = psVar11;
                        puVar10[1] = 0;
                        *(undefined1 *)(puVar10 + 2) = 0;
                        poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                                           ((ostream *)local_240,(char *)local_310,(long)local_308);
                        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                        if (local_310 != (undefined1  [8])(local_308 + 8)) goto LAB_00180732;
                        goto LAB_0018073f;
                      }
                      sVar20 = (storage_t<double>)local_238._0_8_;
                      if ((metas->framesPerSecond)._attrib.has_value_ == false) {
                        (metas->framesPerSecond)._attrib.has_value_ = true;
                      }
                    }
                    (metas->framesPerSecond)._attrib.contained = sVar20;
                  }
                  else {
                    iVar5 = ::std::__cxx11::string::compare((char *)__rhs);
                    if (iVar5 == 0) {
                      tinyusdz::value::Value::get_value<bool>
                                ((Value *)local_240,SUB81(&__rhs->second,0));
                      if (local_240[0] != (ostringstream)0x1) {
                        crate::CrateValue::get_value<std::__cxx11::string>
                                  ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)local_240,&__rhs->second);
                        local_310[0] = (string)local_240[0];
                        if (local_240[0] != (ostringstream)0x1) {
                          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_240,"[error]",7);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_240,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                     ,0x55);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_240,":",1);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_240,"ReconstrcutStageMeta",0x14);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_240,"():",3);
                          poVar9 = (ostream *)
                                   ::std::ostream::operator<<((ostringstream *)local_240,0x67e);
                          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
                          pvVar1 = (__rhs->second).value_.v_.vtable;
                          if (pvVar1 == (vtable_type *)0x0) {
                            local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
                            local_278.field_2._M_allocated_capacity._0_4_ = 0x64696f76;
                            local_278._M_string_length = 4;
                            local_278.field_2._M_allocated_capacity._4_4_ =
                                 local_278.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
                          }
                          else {
                            (*pvVar1->type_name)(&local_278);
                          }
                          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&local_2a0,
                                           "`autoPlay` value must be bool type or string type, but got \'"
                                           ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&local_278);
                          psVar11 = (storage_t<double> *)
                                    ::std::__cxx11::string::append((char *)&local_2a0);
                          sVar20 = (storage_t<double>)(psVar11 + 2);
                          if (*psVar11 == sVar20) {
                            local_2b8 = *(storage_t<double> *)sVar20;
                            sStack_2b0 = psVar11[3];
                            local_2c8 = (storage_t<double>)&local_2b8;
                          }
                          else {
                            local_2b8 = *(storage_t<double> *)sVar20;
                            local_2c8 = *psVar11;
                          }
                          sStack_2c0 = psVar11[1];
                          *psVar11 = sVar20;
                          psVar11[1] = (storage_t<double>)0x0;
                          *(undefined1 *)(psVar11 + 2) = 0;
                          poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                                             ((ostream *)local_240,(char *)local_2c8,
                                              (long)sStack_2c0);
                          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                          if (local_2c8 != (storage_t<double>)&local_2b8) {
                            operator_delete((void *)local_2c8,(long)local_2b8 + 1);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
                            operator_delete(local_2a0._M_dataplus._M_p,
                                            local_2a0.field_2._M_allocated_capacity + 1);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_278._M_dataplus._M_p != &local_278.field_2) {
                            operator_delete(local_278._M_dataplus._M_p,
                                            CONCAT44(local_278.field_2._M_allocated_capacity._4_4_,
                                                     local_278.field_2._M_allocated_capacity._0_4_)
                                            + 1);
                          }
                          goto LAB_0017fbf6;
                        }
                        local_308 = (undefined1  [8])((long)aStack_300._M_local_buf + 8);
                        if ((undefined1 *)local_238._0_8_ == local_228) {
                          paStack_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)CONCAT44(asStack_220._4_4_,
                                                    CONCAT22(asStack_220._2_2_,
                                                             CONCAT11(asStack_220[1],asStack_220[0])
                                                            ));
                        }
                        else {
                          local_308 = (undefined1  [8])local_238._0_8_;
                        }
                        aStack_300._8_8_ = local_228;
                        aStack_300._M_allocated_capacity = local_238._8_8_;
                        iVar5 = ::std::__cxx11::string::compare(local_308);
                        if (iVar5 != 0) {
                          if (local_310[0] != (string)0x0) {
                            iVar5 = ::std::__cxx11::string::compare(local_308);
                            if (iVar5 == 0) {
                              sVar4 = (storage_t<bool>)0x0;
                              goto LAB_0017ec91;
                            }
                            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240)
                            ;
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_240,"[error]",7);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_240,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                       ,0x55);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_240,":",1);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_240,"ReconstrcutStageMeta",0x14);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_240,"():",3);
                            poVar9 = (ostream *)
                                     ::std::ostream::operator<<((ostringstream *)local_240,0x677);
                            ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_240,"Unsupported value for `autoPlay`: ",
                                       0x22);
                            if (local_310[0] != (string)0x0) {
                              this_00 = (ostringstream *)
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)local_240,(char *)local_308,
                                                   aStack_300._M_allocated_capacity);
                              goto LAB_0017fbf1;
                            }
                          }
LAB_00180ee9:
                          pcVar21 = 
                          "value_type &nonstd::optional_lite::optional<std::basic_string<char>>::value() [T = std::basic_string<char>]"
                          ;
LAB_00180f15:
                          __assert_fail("has_value()",
                                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                                        ,0x591,pcVar21);
                        }
                        sVar4 = (storage_t<bool>)0x1;
LAB_0017ec91:
                        if ((metas->autoPlay)._attrib.has_value_ == false) {
                          (metas->autoPlay)._attrib.has_value_ = true;
                        }
                        (metas->autoPlay)._attrib.contained = sVar4;
                        goto LAB_0017dff3;
                      }
                      if ((metas->autoPlay)._attrib.has_value_ == false) {
                        (metas->autoPlay)._attrib.has_value_ = true;
                      }
                      (metas->autoPlay)._attrib.contained = local_240[1];
                    }
                    else {
                      iVar5 = ::std::__cxx11::string::compare((char *)__rhs);
                      if (iVar5 == 0) {
                        crate::CrateValue::get_value<tinyusdz::Token>
                                  ((optional<tinyusdz::Token> *)local_240,&__rhs->second);
                        local_310[0] = (string)local_240[0];
                        if (local_240[0] == (ostringstream)0x1) {
                          local_308 = (undefined1  [8])((long)aStack_300._M_local_buf + 8);
                          if ((undefined1 *)local_238._0_8_ == local_228) {
                            paStack_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)CONCAT44(asStack_220._4_4_,
                                                      CONCAT22(asStack_220._2_2_,
                                                               CONCAT11(asStack_220[1],
                                                                        asStack_220[0])));
                          }
                          else {
                            local_308 = (undefined1  [8])local_238._0_8_;
                          }
                          aStack_300._8_8_ = local_228;
                          aStack_300._M_allocated_capacity = local_238._8_8_;
                          iVar5 = ::std::__cxx11::string::compare(local_308);
                          if (iVar5 == 0) {
                            if ((metas->playbackMode)._attrib.has_value_ == false) {
                              (metas->playbackMode)._attrib.has_value_ = true;
                            }
                            (metas->playbackMode)._attrib.contained =
                                 (storage_t<tinyusdz::LayerMetas::PlaybackMode>)0x0;
                          }
                          else {
                            if (local_310[0] == (string)0x0) {
                              pcVar21 = 
                              "value_type &nonstd::optional_lite::optional<tinyusdz::Token>::value() [T = tinyusdz::Token]"
                              ;
                              goto LAB_00180f15;
                            }
                            iVar5 = ::std::__cxx11::string::compare(local_308);
                            if (iVar5 != 0) {
                              ::std::__cxx11::ostringstream::ostringstream
                                        ((ostringstream *)local_240);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_240,"[error]",7);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_240,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                         ,0x55);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_240,":",1);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_240,"ReconstrcutStageMeta",0x14);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_240,"():",3);
                              poVar9 = (ostream *)
                                       ::std::ostream::operator<<((ostringstream *)local_240,0x688);
                              ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_240,
                                         "Unsupported token value for `playbackMode`.",0x2b);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_240,"\n",1);
                              ::std::__cxx11::stringbuf::str();
                              PushError(local_2d0,(string *)&local_2c8);
                              if (local_2c8 != (storage_t<double>)&local_2b8) {
                                operator_delete((void *)local_2c8,(long)local_2b8 + 1);
                              }
                              ::std::__cxx11::ostringstream::~ostringstream
                                        ((ostringstream *)local_240);
                              ::std::ios_base::~ios_base(local_1d0);
                              goto LAB_00180054;
                            }
                            if ((metas->playbackMode)._attrib.has_value_ == false) {
                              (metas->playbackMode)._attrib.has_value_ = true;
                            }
                            (metas->playbackMode)._attrib.contained =
                                 (storage_t<tinyusdz::LayerMetas::PlaybackMode>)0x1;
                          }
                        }
                        else {
                          crate::CrateValue::get_value<std::__cxx11::string>
                                    ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)local_240,&__rhs->second);
                          local_2c8._0_1_ = local_240[0];
                          if (local_240[0] != (ostringstream)0x1) {
                            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240)
                            ;
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_240,"[error]",7);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_240,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                       ,0x55);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_240,":",1);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_240,"ReconstrcutStageMeta",0x14);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_240,"():",3);
                            poVar9 = (ostream *)
                                     ::std::ostream::operator<<((ostringstream *)local_240,0x698);
                            ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
                            pvVar1 = (__rhs->second).value_.v_.vtable;
                            if (pvVar1 == (vtable_type *)0x0) {
                              local_88.field_2._M_allocated_capacity._0_4_ = 0x64696f76;
                              local_88._M_string_length = 4;
                              local_88.field_2._M_allocated_capacity._4_4_ =
                                   local_88.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
                              local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
                            }
                            else {
                              (*pvVar1->type_name)(&local_88);
                            }
                            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)&local_278,
                                             "`playbackMode` value must be token type, but got \'",
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)&local_88);
                            plVar12 = (long *)::std::__cxx11::string::append((char *)&local_278);
                            psVar15 = (size_type *)(plVar12 + 2);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)*plVar12 ==
                                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)psVar15) {
                              local_2a0.field_2._M_allocated_capacity = *psVar15;
                              local_2a0.field_2._8_8_ = plVar12[3];
                              local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
                            }
                            else {
                              local_2a0.field_2._M_allocated_capacity = *psVar15;
                              local_2a0._M_dataplus._M_p = (pointer)*plVar12;
                            }
                            local_2a0._M_string_length = plVar12[1];
                            *plVar12 = (long)psVar15;
                            plVar12[1] = 0;
                            *(undefined1 *)(plVar12 + 2) = 0;
                            poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                                               ((ostream *)local_240,local_2a0._M_dataplus._M_p,
                                                local_2a0._M_string_length);
                            ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
                              operator_delete(local_2a0._M_dataplus._M_p,
                                              local_2a0.field_2._M_allocated_capacity + 1);
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_278._M_dataplus._M_p != &local_278.field_2) {
                              operator_delete(local_278._M_dataplus._M_p,
                                              CONCAT44(local_278.field_2._M_allocated_capacity._4_4_
                                                       ,local_278.field_2._M_allocated_capacity.
                                                        _0_4_) + 1);
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_88._M_dataplus._M_p != &local_88.field_2) {
                              operator_delete(local_88._M_dataplus._M_p,
                                              CONCAT44(local_88.field_2._M_allocated_capacity._4_4_,
                                                       local_88.field_2._M_allocated_capacity._0_4_)
                                              + 1);
                            }
LAB_00180e5e:
                            ::std::__cxx11::stringbuf::str();
                            PushError(local_2d0,&local_2a0);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
                              operator_delete(local_2a0._M_dataplus._M_p,
                                              local_2a0.field_2._M_allocated_capacity + 1);
                            }
                            ::std::__cxx11::ostringstream::~ostringstream
                                      ((ostringstream *)local_240);
                            ::std::ios_base::~ios_base(local_1d0);
                            if ((local_2c8._0_1_ == '\x01') &&
                               (sVar20 = sStack_2b0, sVar22 = sStack_2c0,
                               sStack_2c0 != (storage_t<double>)&sStack_2b0)) goto LAB_0018004c;
                            goto LAB_00180054;
                          }
                          sStack_2c0 = (storage_t<double>)&sStack_2b0;
                          if ((undefined1 *)local_238._0_8_ == local_228) {
                            uStack_2a8 = CONCAT44(asStack_220._4_4_,
                                                  CONCAT22(asStack_220._2_2_,
                                                           CONCAT11(asStack_220[1],asStack_220[0])))
                            ;
                          }
                          else {
                            sStack_2c0 = (storage_t<double>)local_238._0_8_;
                          }
                          sStack_2b0 = (storage_t<double>)local_228;
                          local_2b8 = (storage_t<double>)local_238._8_8_;
                          iVar5 = ::std::__cxx11::string::compare((char *)&sStack_2c0);
                          if (iVar5 != 0) {
                            if (local_2c8._0_1_ != '\0') {
                              iVar5 = ::std::__cxx11::string::compare((char *)&sStack_2c0);
                              if (iVar5 == 0) {
                                sVar7 = (storage_t<tinyusdz::LayerMetas::PlaybackMode>)0x1;
                                goto LAB_0017ee13;
                              }
                              ::std::__cxx11::ostringstream::ostringstream
                                        ((ostringstream *)local_240);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_240,"[error]",7);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_240,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                         ,0x55);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_240,":",1);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_240,"ReconstrcutStageMeta",0x14);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_240,"():",3);
                              poVar9 = (ostream *)
                                       ::std::ostream::operator<<((ostringstream *)local_240,0x692);
                              ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_240,
                                         "Unsupported value for `playbackMode`: ",0x26);
                              if (local_2c8._0_1_ != '\0') {
                                poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                                                   ((ostream *)local_240,(char *)sStack_2c0,
                                                    (long)local_2b8);
                                ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                                goto LAB_00180e5e;
                              }
                            }
                            goto LAB_00180ee9;
                          }
                          sVar7 = (storage_t<tinyusdz::LayerMetas::PlaybackMode>)0x0;
LAB_0017ee13:
                          if ((metas->playbackMode)._attrib.has_value_ == false) {
                            (metas->playbackMode)._attrib.has_value_ = true;
                          }
                          (metas->playbackMode)._attrib.contained = sVar7;
                          if ((local_2c8._0_1_ == '\x01') &&
                             (sStack_2c0 != (storage_t<double>)&sStack_2b0)) {
                            operator_delete((void *)sStack_2c0,(long)sStack_2b0 + 1);
                          }
                        }
                        if ((local_310[0] != (string)0x1) ||
                           (local_308 == (undefined1  [8])((long)aStack_300._M_local_buf + 8)))
                        goto LAB_0017e1b1;
                        goto LAB_0017e00c;
                      }
                      iVar5 = ::std::__cxx11::string::compare((char *)__rhs);
                      if (iVar5 == 0) {
                        crate::CrateValue::get_value<tinyusdz::Token>
                                  ((optional<tinyusdz::Token> *)local_240,&__rhs->second);
                        oVar18 = local_240[0];
                        local_310[0] = (string)local_240[0];
                        if (local_240[0] == (ostringstream)0x1) {
                          local_308 = (undefined1  [8])((long)aStack_300._M_local_buf + 8);
                          if ((undefined1 *)local_238._0_8_ == local_228) {
                            paStack_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)CONCAT44(asStack_220._4_4_,
                                                      CONCAT22(asStack_220._2_2_,
                                                               CONCAT11(asStack_220[1],
                                                                        asStack_220[0])));
                          }
                          else {
                            local_308 = (undefined1  [8])local_238._0_8_;
                          }
                          aStack_300._8_8_ = local_228;
                          aStack_300._M_allocated_capacity = local_238._8_8_;
                          ::std::__cxx11::string::_M_assign(local_38);
                        }
                        else {
                          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_240,"[error]",7);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_240,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                     ,0x55);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_240,":",1);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_240,"ReconstrcutStageMeta",0x14);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_240,"():",3);
                          poVar9 = (ostream *)
                                   ::std::ostream::operator<<
                                             ((optional<tinyusdz::Token> *)local_240,0x69d);
                          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_240,"`defaultPrim` must be `token` type.",0x23
                                    );
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_240,"\n",1);
                          ::std::__cxx11::stringbuf::str();
                          PushError(local_2d0,(string *)&local_2c8);
                          if (local_2c8 != (storage_t<double>)&local_2b8) {
                            operator_delete((void *)local_2c8,(long)local_2b8 + 1);
                          }
                          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_240);
                          ::std::ios_base::~ios_base(local_1d0);
                          ppVar23 = local_258;
                        }
                        if ((local_310[0] == (string)0x1) &&
                           (local_308 != (undefined1  [8])((long)aStack_300._M_local_buf + 8))) {
                          operator_delete((void *)local_308,aStack_300._8_8_ + 1);
                        }
                        bVar25 = oVar18 == (ostringstream)0x0;
                      }
                      else {
                        iVar5 = ::std::__cxx11::string::compare((char *)__rhs);
                        if (iVar5 == 0) {
                          crate::CrateValue::
                          get_value<std::map<std::__cxx11::string,tinyusdz::MetaVariable,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::MetaVariable>>>>
                                    ((optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
                                      *)local_240,&__rhs->second);
                          puVar3 = (undefined1 *)CONCAT44(asStack_220._4_4_,asStack_220._8_4_);
                          local_310[0] = (string)local_240[0];
                          oVar18 = local_240[0];
                          if (local_240[0] == (ostringstream)0x1) {
                            if ((storage_t<double>)local_228 == (storage_t<double>)0x0) {
                              aStack_300._8_8_ = (storage_t<double>)0x0;
                              paStack_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)(local_308 + 8);
                              uVar8 = 0;
                              paVar13 = &local_2e0;
                              local_2e8 = paStack_2f0;
                            }
                            else {
                              aStack_300._8_8_ = local_228;
                              paStack_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)CONCAT44(asStack_220._4_4_,
                                                        CONCAT22(asStack_220._2_2_,
                                                                 CONCAT11(asStack_220[1],
                                                                          asStack_220[0])));
                              local_2e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)CONCAT44(asStack_220._12_4_,asStack_220._8_4_);
                              *(undefined1 **)((long)local_228 + 8) = local_308 + 8;
                              local_2e0._M_allocated_capacity =
                                   CONCAT71(local_210._M_allocated_capacity._1_7_,
                                            local_210._M_local_buf[0]);
                              local_228 = (undefined1  [8])0x0;
                              puVar3 = local_238 + 8;
                              asStack_220[0] = SUB81(puVar3,0);
                              asStack_220[1] = SUB81((ulong)puVar3 >> 8,0);
                              asStack_220._2_2_ = (undefined2)((ulong)puVar3 >> 0x10);
                              asStack_220._4_4_ = (undefined4)((ulong)puVar3 >> 0x20);
                              paVar13 = &local_210;
                              uVar8 = local_238._8_4_;
                              asStack_220._12_4_ = asStack_220._4_4_;
                            }
                            asStack_220._4_4_ = (undefined4)((ulong)puVar3 >> 0x20);
                            asStack_220._8_4_ = SUB84(puVar3,0);
                            paVar13->_M_allocated_capacity = 0;
                            aStack_300._M_allocated_capacity._0_4_ = uVar8;
                            ::std::
                            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                            ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                        *)local_238,(_Link_type)0x0);
                            oVar18 = (ostringstream)local_310[0];
                          }
                          if (((byte)oVar18 & 1) == 0) {
                            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240)
                            ;
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_240,"[error]",7);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_240,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                       ,0x55);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_240,":",1);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_240,"ReconstrcutStageMeta",0x14);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_240,"():",3);
                            poVar9 = (ostream *)
                                     ::std::ostream::operator<<((ostringstream *)local_240,0x6a8);
                            ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
                            pvVar1 = (__rhs->second).value_.v_.vtable;
                            if (pvVar1 == (vtable_type *)0x0) {
                              local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
                              local_2a0._M_string_length = 4;
                              local_2a0.field_2._M_allocated_capacity._0_5_ = 0x64696f76;
                            }
                            else {
                              (*pvVar1->type_name)(&local_2a0);
                            }
                            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)&local_2c8,
                                             "customLayerData must be `dictionary` type, but got type `"
                                             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)&local_2a0);
                            poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                                               ((ostream *)local_240,(char *)local_2c8,
                                                (long)sStack_2c0);
                            ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                            if (local_2c8 != (storage_t<double>)&local_2b8) {
                              operator_delete((void *)local_2c8,(long)local_2b8 + 1);
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
                              operator_delete(local_2a0._M_dataplus._M_p,
                                              local_2a0.field_2._M_allocated_capacity + 1);
                            }
                            ::std::__cxx11::stringbuf::str();
                            PushError(local_2d0,(string *)&local_2c8);
                            if (local_2c8 != (storage_t<double>)&local_2b8) {
                              operator_delete((void *)local_2c8,(long)local_2b8 + 1);
                            }
                            ::std::__cxx11::ostringstream::~ostringstream
                                      ((ostringstream *)local_240);
                            ::std::ios_base::~ios_base(local_1d0);
                            ppVar23 = local_258;
                          }
                          else {
                            std::
                            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                            ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                         *)local_40,
                                        (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                         *)local_308);
                          }
                          if (local_310[0] == (string)0x1) {
                            ::std::
                            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                            ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                        *)local_308,(_Link_type)aStack_300._8_8_);
                          }
                        }
                        else {
                          iVar5 = ::std::__cxx11::string::compare((char *)__rhs);
                          if (iVar5 != 0) {
                            iVar5 = ::std::__cxx11::string::compare((char *)__rhs);
                            if (iVar5 == 0) {
                              crate::CrateValue::get_value<std::__cxx11::string>
                                        ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)local_240,&__rhs->second);
                              local_310[0] = (string)local_240[0];
                              local_280 = (StageMetas *)CONCAT71(local_280._1_7_,local_240[0]);
                              if (local_240[0] == (ostringstream)0x1) {
                                local_308 = (undefined1  [8])((long)aStack_300._M_local_buf + 8);
                                if ((undefined1 *)local_238._0_8_ == local_228) {
                                  paStack_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                 *)CONCAT44(asStack_220._4_4_,
                                                            CONCAT22(asStack_220._2_2_,
                                                                     CONCAT11(asStack_220[1],
                                                                              asStack_220[0])));
                                }
                                else {
                                  local_308 = (undefined1  [8])local_238._0_8_;
                                }
                                aStack_300._8_8_ = local_228;
                                aStack_300._M_allocated_capacity = local_238._8_8_;
                                _local_240 = local_238 + 8;
                                local_238._0_8_ = (storage_t<double>)0x0;
                                local_238._8_8_ = local_238._8_8_ & 0xffffffffffffff00;
                                asStack_220[0] = (string)0x0;
                                asStack_220[1] = (string)0x0;
                                asStack_220[4] = (string)0x0;
                                asStack_220[5] = (string)0x0;
                                asStack_220[6] = (string)0x0;
                                asStack_220[7] = (string)0x0;
                                asStack_220[8] = (string)0x0;
                                asStack_220[9] = (string)0x0;
                                asStack_220[10] = (string)0x0;
                                asStack_220[0xb] = (string)0x0;
                                ::std::__cxx11::string::_M_assign((string *)local_240);
                                asStack_220[0] = (string)false;
                                if ((storage_t<double>)local_238._0_8_ != (storage_t<double>)0x0) {
                                  asStack_220[0] = (string)0x1;
                                  sVar20 = (storage_t<double>)0x1;
                                  do {
                                    if ((_local_240[(long)sVar20 + -1] == '\n') ||
                                       (_local_240[(long)sVar20 + -1] == '\r')) break;
                                    asStack_220[0] =
                                         (string)((ulong)sVar20 < (ulong)local_238._0_8_);
                                    bVar25 = sVar20 != (storage_t<double>)local_238._0_8_;
                                    sVar20 = (storage_t<double>)((long)sVar20 + 1);
                                  } while (bVar25);
                                }
                                ::std::__cxx11::string::_M_assign(local_50);
                                pbVar16 = local_58;
                                goto LAB_0017f6d7;
                              }
                              ::std::__cxx11::ostringstream::ostringstream
                                        ((ostringstream *)local_240);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_240,"[error]",7);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_240,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                         ,0x55);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_240,":",1);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_240,"ReconstrcutStageMeta",0x14);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_240,"():",3);
                              poVar9 = (ostream *)
                                       ::std::ostream::operator<<
                                                 ((
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)local_240,0x6b6);
                              ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
                              pvVar1 = (__rhs->second).value_.v_.vtable;
                              if (pvVar1 == (vtable_type *)0x0) {
                                local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
                                local_2a0._M_string_length = 4;
                                local_2a0.field_2._M_allocated_capacity._0_5_ = 0x64696f76;
                              }
                              else {
                                (*pvVar1->type_name)(&local_2a0);
                              }
                              pcVar21 = "Type must be `string` for `documentation`, but got ";
LAB_0017f74a:
                              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)&local_2c8,pcVar21,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)&local_2a0);
                              poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                                                 ((ostream *)local_240,(char *)local_2c8,
                                                  (long)sStack_2c0);
                              ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                              if (local_2c8 != (storage_t<double>)&local_2b8) {
                                operator_delete((void *)local_2c8,(long)local_2b8 + 1);
                              }
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
                                operator_delete(local_2a0._M_dataplus._M_p,
                                                local_2a0.field_2._M_allocated_capacity + 1);
                              }
                              ::std::__cxx11::stringbuf::str();
                              PushError(local_2d0,(string *)&local_2c8);
                              if (local_2c8 != (storage_t<double>)&local_2b8) {
                                operator_delete((void *)local_2c8,(long)local_2b8 + 1);
                              }
                              ::std::__cxx11::ostringstream::~ostringstream
                                        ((ostringstream *)local_240);
                              ::std::ios_base::~ios_base(local_1d0);
                              ppVar23 = local_258;
                            }
                            else {
                              iVar5 = ::std::__cxx11::string::compare((char *)__rhs);
                              if (iVar5 != 0) {
                                ::std::__cxx11::ostringstream::ostringstream
                                          ((ostringstream *)local_240);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_240,"[warn]",6);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_240,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                           ,0x55);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_240,":",1);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_240,"ReconstrcutStageMeta",0x14);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_240,"():",3);
                                poVar9 = (ostream *)
                                         ::std::ostream::operator<<
                                                   ((ostringstream *)local_240,0x6c9);
                                ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
                                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_310,"[StageMeta] TODO: ",
                                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)__rhs);
                                poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                                                   ((ostream *)local_240,(char *)local_310,
                                                    (long)local_308);
                                ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                                if (local_310 != (undefined1  [8])(local_308 + 8)) {
                                  operator_delete((void *)local_310,
                                                  aStack_300._M_allocated_capacity + 1);
                                }
                                ::std::__cxx11::stringbuf::str();
                                PushWarn(local_2d0,(string *)local_310);
                                if (local_310 != (undefined1  [8])(local_308 + 8)) {
                                  operator_delete((void *)local_310,
                                                  aStack_300._M_allocated_capacity + 1);
                                }
                                ::std::__cxx11::ostringstream::~ostringstream
                                          ((ostringstream *)local_240);
                                ::std::ios_base::~ios_base(local_1d0);
                                goto LAB_0017e1b1;
                              }
                              crate::CrateValue::get_value<std::__cxx11::string>
                                        ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)local_240,&__rhs->second);
                              local_310[0] = (string)local_240[0];
                              local_280 = (StageMetas *)CONCAT71(local_280._1_7_,local_240[0]);
                              if (local_240[0] != (ostringstream)0x1) {
                                ::std::__cxx11::ostringstream::ostringstream
                                          ((ostringstream *)local_240);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_240,"[error]",7);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_240,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                           ,0x55);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_240,":",1);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_240,"ReconstrcutStageMeta",0x14);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_240,"():",3);
                                poVar9 = (ostream *)
                                         ::std::ostream::operator<<
                                                   ((
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)local_240,0x6c1);
                                ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
                                pvVar1 = (__rhs->second).value_.v_.vtable;
                                if (pvVar1 == (vtable_type *)0x0) {
                                  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
                                  local_2a0._M_string_length = 4;
                                  local_2a0.field_2._M_allocated_capacity._0_5_ = 0x64696f76;
                                }
                                else {
                                  (*pvVar1->type_name)(&local_2a0);
                                }
                                pcVar21 = "Type must be `string` for `comment`, but got ";
                                goto LAB_0017f74a;
                              }
                              local_308 = (undefined1  [8])((long)aStack_300._M_local_buf + 8);
                              if ((undefined1 *)local_238._0_8_ == local_228) {
                                paStack_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                               *)CONCAT44(asStack_220._4_4_,
                                                          CONCAT22(asStack_220._2_2_,
                                                                   CONCAT11(asStack_220[1],
                                                                            asStack_220[0])));
                              }
                              else {
                                local_308 = (undefined1  [8])local_238._0_8_;
                              }
                              aStack_300._8_8_ = local_228;
                              aStack_300._M_allocated_capacity = local_238._8_8_;
                              _local_240 = local_238 + 8;
                              local_238._0_8_ = (storage_t<double>)0x0;
                              local_238._8_8_ = local_238._8_8_ & 0xffffffffffffff00;
                              asStack_220[0] = (string)0x0;
                              asStack_220[1] = (string)0x0;
                              asStack_220[4] = (string)0x0;
                              asStack_220[5] = (string)0x0;
                              asStack_220[6] = (string)0x0;
                              asStack_220[7] = (string)0x0;
                              asStack_220[8] = (string)0x0;
                              asStack_220[9] = (string)0x0;
                              asStack_220[10] = (string)0x0;
                              asStack_220[0xb] = (string)0x0;
                              ::std::__cxx11::string::_M_assign((string *)local_240);
                              asStack_220[0] = (string)false;
                              if ((storage_t<double>)local_238._0_8_ != (storage_t<double>)0x0) {
                                asStack_220[0] = (string)0x1;
                                sVar20 = (storage_t<double>)0x1;
                                do {
                                  if ((_local_240[(long)sVar20 + -1] == '\n') ||
                                     (_local_240[(long)sVar20 + -1] == '\r')) break;
                                  asStack_220[0] = (string)((ulong)sVar20 < (ulong)local_238._0_8_);
                                  bVar25 = sVar20 != (storage_t<double>)local_238._0_8_;
                                  sVar20 = (storage_t<double>)((long)sVar20 + 1);
                                } while (bVar25);
                              }
                              ::std::__cxx11::string::_M_assign(local_60);
                              pbVar16 = local_68;
LAB_0017f6d7:
                              *(undefined4 *)(pbVar16 + 8) = asStack_220._8_4_;
                              *(ulong *)pbVar16 =
                                   CONCAT44(asStack_220._4_4_,
                                            CONCAT22(asStack_220._2_2_,
                                                     CONCAT11(asStack_220[1],asStack_220[0])));
                              if (_local_240 != local_238 + 8) {
                                operator_delete(_local_240,local_238._8_8_ + 1);
                              }
                            }
                            if ((local_310[0] == (string)0x1) &&
                               (local_308 != (undefined1  [8])((long)aStack_300._M_local_buf + 8)))
                            {
                              operator_delete((void *)local_308,aStack_300._8_8_ + 1);
                            }
                            bVar25 = (char)local_280 == '\0';
                            goto LAB_0017e657;
                          }
                          crate::CrateValue::
                          get_value<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
                                    ((optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                                      *)local_240,&__rhs->second);
                          local_310[0] = (string)local_240[0];
                          oVar18 = local_240[0];
                          if (local_240[0] == (ostringstream)0x1) {
                            local_308 = (undefined1  [8])local_238._0_8_;
                            aStack_300._M_allocated_capacity = local_238._8_8_;
                            aStack_300._8_8_ = local_228;
                            local_238._0_8_ = (storage_t<double>)0x0;
                            local_238._8_8_ = (storage_t<double>)0x0;
                            local_228 = (undefined1  [8])0x0;
                            ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::
                            ~vector((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                                    local_238);
                            oVar18 = (ostringstream)local_310[0];
                          }
                          if (((byte)oVar18 & 1) == 0) {
                            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240)
                            ;
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_240,"[error]",7);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_240,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                       ,0x55);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_240,":",1);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_240,"ReconstrcutStageMeta",0x14);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_240,"():",3);
                            poVar9 = (ostream *)
                                     ::std::ostream::operator<<((ostringstream *)local_240,0x6ae);
                            ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
                            pvVar1 = (__rhs->second).value_.v_.vtable;
                            if (pvVar1 == (vtable_type *)0x0) {
                              local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
                              local_2a0._M_string_length = 4;
                              local_2a0.field_2._M_allocated_capacity._0_5_ = 0x64696f76;
                            }
                            else {
                              (*pvVar1->type_name)(&local_2a0);
                            }
                            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)&local_2c8,
                                             "Type must be `token[]` for `primChildren`, but got ",
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)&local_2a0);
                            poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                                               ((ostream *)local_240,(char *)local_2c8,
                                                (long)sStack_2c0);
                            ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                            if (local_2c8 != (storage_t<double>)&local_2b8) {
                              operator_delete((void *)local_2c8,(long)local_2b8 + 1);
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
                              operator_delete(local_2a0._M_dataplus._M_p,
                                              local_2a0.field_2._M_allocated_capacity + 1);
                            }
                            ::std::__cxx11::stringbuf::str();
                            PushError(local_2d0,(string *)&local_2c8);
                            if (local_2c8 != (storage_t<double>)&local_2b8) {
                              operator_delete((void *)local_2c8,(long)local_2b8 + 1);
                            }
                            ::std::__cxx11::ostringstream::~ostringstream
                                      ((ostringstream *)local_240);
                            ::std::ios_base::~ios_base(local_1d0);
                            ppVar23 = local_258;
                          }
                          else {
                            std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::
                            operator=((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                                      local_48,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                                *)local_308);
                          }
                          if (local_310[0] == (string)0x1) {
                            ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::
                            ~vector((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                                    local_308);
                          }
                        }
LAB_0017e654:
                        bVar25 = ((byte)oVar18 & 1) == 0;
                      }
LAB_0017e657:
                      if (bVar25) goto LAB_001803f5;
                    }
                  }
                }
              }
            }
          }
        }
      }
LAB_0017e1b1:
      __rhs = __rhs + 1;
    } while (__rhs != ppVar23);
    this = local_2d0;
    if (local_a8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_a8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) goto LAB_0017f9ff;
    local_2c8 = (storage_t<double>)0x0;
    sStack_2c0 = (storage_t<double>)0x0;
    local_2b8 = (storage_t<double>)0x0;
    local_280 = metas;
    if (local_a8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_a8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar14 = 0;
    }
    else {
      lVar24 = 8;
      uVar19 = 0;
      local_258 = (pointer)0x0;
      uStack_250 = 0;
      uStack_24c = 0x3ff00000;
      local_258._0_4_ = 0;
      local_258._4_4_ = 0;
      do {
        _local_240 = local_238 + 8;
        local_238._0_8_ = (storage_t<double>)0x0;
        local_238._8_8_ = local_238._8_8_ & 0xffffffffffffff00;
        asStack_220[0] = SUB81(&local_210,0);
        asStack_220[1] = SUB81((ulong)&local_210 >> 8,0);
        asStack_220._2_2_ = (undefined2)((ulong)&local_210 >> 0x10);
        asStack_220._4_4_ = (undefined4)((ulong)&local_210 >> 0x20);
        asStack_220[8] = (string)0x0;
        asStack_220[9] = (string)0x0;
        asStack_220[10] = (string)0x0;
        asStack_220[0xb] = (string)0x0;
        asStack_220[0xc] = (string)0x0;
        asStack_220[0xd] = (string)0x0;
        asStack_220[0xe] = (string)0x0;
        asStack_220[0xf] = (string)0x0;
        local_210._M_local_buf[0] = '\0';
        local_310 = (undefined1  [8])(local_308 + 8);
        lVar17 = *(long *)((long)local_a8.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar24 + -8);
        local_200 = (undefined4)local_258;
        uStack_1fc = local_258._4_4_;
        uStack_1f8 = uStack_250;
        uStack_1f4 = uStack_24c;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_310,lVar17,
                   *(long *)((long)&((local_a8.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                            + lVar24) + lVar17);
        local_2e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
        local_2e0._M_allocated_capacity = local_2e0._M_allocated_capacity & 0xffffffffffffff00;
        paStack_2f0 = &local_2e0;
        ::std::__cxx11::string::operator=((string *)local_240,(string *)local_310);
        ::std::__cxx11::string::operator=(asStack_220,(string *)&paStack_2f0);
        if (paStack_2f0 != &local_2e0) {
          operator_delete(paStack_2f0,local_2e0._M_allocated_capacity + 1);
        }
        if (local_310 != (undefined1  [8])(local_308 + 8)) {
          operator_delete((void *)local_310,aStack_300._M_allocated_capacity + 1);
        }
        ::std::vector<tinyusdz::SubLayer,_std::allocator<tinyusdz::SubLayer>_>::push_back
                  ((vector<tinyusdz::SubLayer,_std::allocator<tinyusdz::SubLayer>_> *)&local_2c8,
                   (value_type *)local_240);
        paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(asStack_220._4_4_,
                              CONCAT22(asStack_220._2_2_,CONCAT11(asStack_220[1],asStack_220[0])));
        if (paVar13 != &local_210) {
          operator_delete(paVar13,CONCAT71(local_210._M_allocated_capacity._1_7_,
                                           local_210._M_local_buf[0]) + 1);
        }
        if (_local_240 != local_238 + 8) {
          operator_delete(_local_240,local_238._8_8_ + 1);
        }
        uVar19 = uVar19 + 1;
        uVar14 = (long)local_a8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_a8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5;
        lVar24 = lVar24 + 0x20;
      } while (uVar19 < uVar14);
    }
    if (uVar14 == (long)local_c8.
                        super__Vector_base<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_c8.
                        super__Vector_base<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4 &&
        (long)local_c8.
              super__Vector_base<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_c8.
              super__Vector_base<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      lVar24 = 0x40;
      lVar17 = 0;
      uVar14 = 0;
      do {
        puVar10 = (undefined8 *)
                  ((long)&(local_c8.
                           super__Vector_base<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_offset + lVar17);
        uVar2 = puVar10[1];
        *(undefined8 *)((long)local_2c8 + lVar24) = *puVar10;
        ((undefined8 *)((long)local_2c8 + lVar24))[1] = uVar2;
        uVar14 = uVar14 + 1;
        lVar17 = lVar17 + 0x10;
        lVar24 = lVar24 + 0x50;
      } while (uVar14 < (ulong)((long)local_c8.
                                      super__Vector_base<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_c8.
                                      super__Vector_base<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 4));
    }
    std::vector<tinyusdz::SubLayer,_std::allocator<tinyusdz::SubLayer>_>::operator=
              ((vector<tinyusdz::SubLayer,_std::allocator<tinyusdz::SubLayer>_> *)
               &local_280->subLayers,
               (vector<tinyusdz::SubLayer,_std::allocator<tinyusdz::SubLayer>_> *)&local_2c8);
    ::std::vector<tinyusdz::SubLayer,_std::allocator<tinyusdz::SubLayer>_>::~vector
              ((vector<tinyusdz::SubLayer,_std::allocator<tinyusdz::SubLayer>_> *)&local_2c8);
  }
  bVar25 = true;
LAB_001803ff:
  if (local_c8.super__Vector_base<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.
                    super__Vector_base<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.
                          super__Vector_base<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.
                          super__Vector_base<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_a8);
  return bVar25;
}

Assistant:

bool USDCReader::Impl::ReconstrcutStageMeta(
    const crate::FieldValuePairVector &fvs, StageMetas *metas) {
  /// Stage(toplevel layer) Meta fieldSet example.
  ///
  ///   specTy = SpecTypePseudoRoot
  ///
  ///     - subLayers(+ subLayerOffsets)
  ///     - customLayerData(dict)
  ///     - defaultPrim(token)
  ///     - metersPerUnit(double)
  ///     - kilogramsPerUnit(double)
  ///     - timeCodesPerSecond(double)
  ///     - upAxis(token)
  ///     - documentation(string) : `doc`
  ///     - comment(string) : comment
  ///     - primChildren(token[]) : Crate only. List of root prims(Root Prim should be traversed based on this array)

  std::vector<std::string> subLayers;
  std::vector<LayerOffset> subLayerOffsets;

  for (const auto &fv : fvs) {
    if (fv.first == "upAxis") {
      auto vt = fv.second.get_value<value::token>();
      if (!vt) {
        PUSH_ERROR_AND_RETURN("`upAxis` must be `token` type.");
      }

      std::string v = vt.value().str();
      if (v == "Y") {
        metas->upAxis = Axis::Y;
      } else if (v == "Z") {
        metas->upAxis = Axis::Z;
      } else if (v == "X") {
        metas->upAxis = Axis::X;
      } else {
        PUSH_ERROR_AND_RETURN("`upAxis` must be 'X', 'Y' or 'Z' but got '" + v +
                              "'(note: Case sensitive)");
      }
      DCOUT("upAxis = " << to_string(metas->upAxis.get_value()));

    } else if (fv.first == "metersPerUnit") {
      if (auto vf = fv.second.get_value<float>()) {
        metas->metersPerUnit = double(vf.value());
      } else if (auto vd = fv.second.get_value<double>()) {
        metas->metersPerUnit = vd.value();
      } else {
        PUSH_ERROR_AND_RETURN(
            "`metersPerUnit` value must be double or float type, but got '" +
            fv.second.type_name() + "'");
      }
      DCOUT("metersPerUnit = " << metas->metersPerUnit.get_value());
    } else if (fv.first == "kilogramsPerUnit") {
      if (auto vf = fv.second.get_value<float>()) {
        metas->kilogramsPerUnit = double(vf.value());
      } else if (auto vd = fv.second.get_value<double>()) {
        metas->kilogramsPerUnit = vd.value();
      } else {
        PUSH_ERROR_AND_RETURN(
            "`kilogramsPerUnit` value must be double or float type, but got '" +
            fv.second.type_name() + "'");
      }
      DCOUT("kilogramsPerUnit = " << metas->kilogramsPerUnit.get_value());
    } else if (fv.first == "timeCodesPerSecond") {
      if (auto vf = fv.second.get_value<float>()) {
        metas->timeCodesPerSecond = double(vf.value());
      } else if (auto vd = fv.second.get_value<double>()) {
        metas->timeCodesPerSecond = vd.value();
      } else {
        PUSH_ERROR_AND_RETURN(
            "`timeCodesPerSecond` value must be double or float "
            "type, but got '" +
            fv.second.type_name() + "'");
      }
      DCOUT("timeCodesPerSecond = " << metas->timeCodesPerSecond.get_value());
    } else if (fv.first == "startTimeCode") {
      if (auto vf = fv.second.get_value<float>()) {
        metas->startTimeCode = double(vf.value());
      } else if (auto vd = fv.second.get_value<double>()) {
        metas->startTimeCode = vd.value();
      } else {
        PUSH_ERROR_AND_RETURN(
            "`startTimeCode` value must be double or float "
            "type, but got '" +
            fv.second.type_name() + "'");
      }
      DCOUT("startimeCode = " << metas->startTimeCode.get_value());
    } else if (fv.first == "subLayers") {
      if (auto vs = fv.second.get_value<std::vector<std::string>>()) {
        subLayers = vs.value();
      } else {
        PUSH_ERROR_AND_RETURN(
            "`subLayers` value must be string[] "
            "type, but got '" +
            fv.second.type_name() + "'");
      }
    } else if (fv.first == "subLayerOffsets") {
      if (auto vs = fv.second.get_value<std::vector<LayerOffset>>()) {
        subLayerOffsets = vs.value();
      } else {
        PUSH_ERROR_AND_RETURN(
            "`subLayerOffsets` value must be LayerOffset[] "
            "type, but got '" +
            fv.second.type_name() + "'");
      }
    } else if (fv.first == "endTimeCode") {
      if (auto vf = fv.second.get_value<float>()) {
        metas->endTimeCode = double(vf.value());
      } else if (auto vd = fv.second.get_value<double>()) {
        metas->endTimeCode = vd.value();
      } else {
        PUSH_ERROR_AND_RETURN(
            "`endTimeCode` value must be double or float "
            "type, but got '" +
            fv.second.type_name() + "'");
      }
      DCOUT("endTimeCode = " << metas->endTimeCode.get_value());
    } else if (fv.first == "framesPerSecond") {
      if (auto vf = fv.second.get_value<float>()) {
        metas->framesPerSecond = double(vf.value());
      } else if (auto vd = fv.second.get_value<double>()) {
        metas->framesPerSecond = vd.value();
      } else {
        PUSH_ERROR_AND_RETURN(
            "`framesPerSecond` value must be double or float "
            "type, but got '" +
            fv.second.type_name() + "'");
      }
      DCOUT("framesPerSecond = " << metas->framesPerSecond.get_value());
    } else if (fv.first == "autoPlay") {
      if (auto vf = fv.second.get_value<bool>()) {
        metas->autoPlay = vf.value();
      } else if (auto vs = fv.second.get_value<std::string>()) {
        // unregisteredvalue uses string type.
        bool autoPlay{true};
        if (vs.value() == "true") {
          autoPlay = true;
        } else if (vs.value() == "false") {
          autoPlay = false;
        } else {
          PUSH_ERROR_AND_RETURN(
              "Unsupported value for `autoPlay`: " << vs.value());
        }
        metas->autoPlay = autoPlay;
      } else {
        PUSH_ERROR_AND_RETURN(
            "`autoPlay` value must be bool "
            "type or string type, but got '" +
            fv.second.type_name() + "'");
      }
      DCOUT("autoPlay = " << metas->autoPlay.get_value());
    } else if (fv.first == "playbackMode") {
      if (auto vf = fv.second.get_value<value::token>()) {
        if (vf.value().str() == "none") {
          metas->playbackMode = StageMetas::PlaybackMode::PlaybackModeNone;
        } else if (vf.value().str() == "loop") {
          metas->playbackMode = StageMetas::PlaybackMode::PlaybackModeLoop;
        } else {
          PUSH_ERROR_AND_RETURN("Unsupported token value for `playbackMode`.");
        }
      } else if (auto vs = fv.second.get_value<std::string>()) {
        // unregisteredvalue uses string type.
        if (vs.value() == "none") {
          metas->playbackMode = StageMetas::PlaybackMode::PlaybackModeNone;
        } else if (vs.value() == "loop") {
          metas->playbackMode = StageMetas::PlaybackMode::PlaybackModeLoop;
        } else {
          PUSH_ERROR_AND_RETURN(
              "Unsupported value for `playbackMode`: " << vs.value());
        }
      } else {
        PUSH_ERROR_AND_RETURN(
            "`playbackMode` value must be token "
            "type, but got '" +
            fv.second.type_name() + "'");
      }
    } else if ((fv.first == "defaultPrim")) {
      auto v = fv.second.get_value<value::token>();
      if (!v) {
        PUSH_ERROR_AND_RETURN("`defaultPrim` must be `token` type.");
      }

      metas->defaultPrim = v.value();
      DCOUT("defaultPrim = " << metas->defaultPrim.str());
    } else if (fv.first == "customLayerData") {
      if (auto v = fv.second.get_value<CustomDataType>()) {
        metas->customLayerData = v.value();
      } else {
        PUSH_ERROR_AND_RETURN(
            "customLayerData must be `dictionary` type, but got type `" +
            fv.second.type_name());
      }
    } else if (fv.first == "primChildren") {  // only appears in USDC.
      auto v = fv.second.get_value<std::vector<value::token>>();
      if (!v) {
        PUSH_ERROR_AND_RETURN("Type must be `token[]` for `primChildren`, but got " +
                   fv.second.type_name());
      }

      metas->primChildren = v.value();
    } else if (fv.first == "documentation") {  // 'doc'
      auto v = fv.second.get_value<std::string>();
      if (!v) {
        PUSH_ERROR_AND_RETURN("Type must be `string` for `documentation`, but got " +
                   fv.second.type_name());
      }
      value::StringData sdata;
      sdata.value = v.value();
      sdata.is_triple_quoted = hasNewline(sdata.value);
      metas->doc = sdata;
      DCOUT("doc = " << metas->doc.value);
    } else if (fv.first == "comment") {  // 'comment'
      auto v = fv.second.get_value<std::string>();
      if (!v) {
        PUSH_ERROR_AND_RETURN("Type must be `string` for `comment`, but got " +
                   fv.second.type_name());
      }
      value::StringData sdata;
      sdata.value = v.value();
      sdata.is_triple_quoted = hasNewline(sdata.value);
      metas->comment = sdata;
      DCOUT("comment = " << metas->comment.value);
    } else {
      PUSH_WARN("[StageMeta] TODO: " + fv.first);
    }
  }

  if (subLayers.size()) {
    std::vector<SubLayer> dst;
    for (size_t i = 0; i < subLayers.size(); i++) {
      SubLayer s;
      s.assetPath = subLayers[i];
      dst.push_back(s);
    }

    if (subLayers.size() == subLayerOffsets.size()) {
      for (size_t i = 0; i < subLayerOffsets.size(); i++) {
        dst[i].layerOffset = subLayerOffsets[i];
      }
    }

    metas->subLayers = dst;

  } else if (subLayerOffsets.size()) {
    PUSH_WARN("Corrupted subLayer info? `subLayers` Fileld not found.");
  }

  return true;
}